

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_U_mult_inplace(m256v *LU,m256v *X_inout)

{
  int iVar1;
  int j;
  long lVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = LU->n_col;
  lVar3 = 1;
  for (lVar4 = 0; (lVar4 < iVar1 && (lVar4 < LU->n_row)); lVar4 = lVar4 + 1) {
    m256v_mult_row(X_inout,(int)lVar4,LU->e[lVar4 + LU->rstride * lVar4]);
    lVar2 = lVar3;
    while( true ) {
      iVar1 = LU->n_col;
      if (iVar1 <= (int)lVar2) break;
      m256v_multadd_row(X_inout,(int)lVar2,LU->e[lVar2 + LU->rstride * lVar4],X_inout,(int)lVar4);
      lVar2 = lVar2 + 1;
    }
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void MV_GEN_N(_U_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = 0; i < LU->n_col && i < LU->n_row; ++i) {
		MV_GEN_N(_mult_row)(X_inout, i, MV_GEN_N(_get_el)(LU, i, i));
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_inout, j,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, i);
		}
	}
}